

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O1

void nh_describe_pos(int x,int y,nh_desc_buf *bufs)

{
  byte bVar1;
  monst *pmVar2;
  bool bVar3;
  bool bVar4;
  boolean bVar5;
  aligntyp alignment;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  monst *pmVar10;
  trap *ptVar11;
  obj *poVar12;
  char *pcVar13;
  size_t sVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  bool bVar23;
  uint uVar24;
  bool bVar25;
  char visionbuf [256];
  char race [128];
  char steedbuf [256];
  char local_338 [6];
  undefined8 uStack_332;
  undefined2 auStack_328 [120];
  char local_238 [256];
  char local_138 [264];
  
  iVar6 = dbuf_get_mon(x,y);
  bufs->bgdesc[0] = '\0';
  bufs->trapdesc[0] = '\0';
  bufs->objdesc[0] = '\0';
  bufs->mondesc[0] = '\0';
  bufs->invisdesc[0] = '\0';
  bufs->effectdesc[0] = '\0';
  bufs->objcount = -1;
  if (program_state.game_running == 0) {
    return;
  }
  iVar16 = exit_jmp_buf_valid + 1;
  bVar25 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar16;
  if ((bVar25) && (iVar16 = __sigsetjmp(exit_jmp_buf,1), iVar16 != 0)) {
    return;
  }
  uVar17 = *(uint *)(level->locations[x] + y) & 0x3f;
  if (uVar17 < 0x18) {
    if (uVar17 != 0) {
      if (uVar17 == 0x13) {
        bVar5 = on_level(&u.uz,&dungeon_topology.d_air_level);
        pcVar19 = "cloudy area";
        if (bVar5 == '\0') {
          pcVar19 = "fog/vapor cloud";
        }
      }
      else {
LAB_0020b66d:
        pcVar19 = defexplain[uVar17];
      }
      strcpy(bufs->bgdesc,pcVar19);
    }
  }
  else if (uVar17 == 0x18) {
    iVar16 = is_drawbridge_wall(x,y);
    if (iVar16 < 0) {
      if ((*(uint *)&level->locations[x][y].field_0x6 & 0xf0) != 0x10) {
        uVar9 = 0x796177726f6f64;
        goto LAB_0020b707;
      }
      builtin_strncpy(bufs->bgdesc,"broken door",0xc);
    }
    else {
      builtin_strncpy(bufs->bgdesc,"open drawbridge portcullis",0x1b);
    }
  }
  else {
    if (uVar17 != 0x26) goto LAB_0020b66d;
    if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
      builtin_strncpy(bufs->bgdesc + 6,"d altar",8);
      uVar9 = 0x2064656e67696c61;
LAB_0020b707:
      *(undefined8 *)bufs->bgdesc = uVar9;
    }
    else {
      uVar17 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x17;
      if (uVar17 == 0) {
        alignment = -0x80;
      }
      else if (uVar17 == 4) {
        alignment = '\x01';
      }
      else {
        alignment = (char)uVar17 + -2;
      }
      pcVar19 = align_str(alignment);
      sprintf(bufs->bgdesc,"%s altar",pcVar19,0);
    }
  }
  if ((undefined1  [12])((undefined1  [12])level->locations[x][y] & (undefined1  [12])0x7c0) !=
      (undefined1  [12])0x0) {
    if ((iVar6 < 0x194 && iVar6 != 0) && ((u.ux != x || (u.uy != y)))) {
      pmVar2 = level->monsters[x][y];
      if (pmVar2 == (monst *)0x0) {
        pmVar10 = (monst *)0x0;
      }
      else {
        pmVar10 = (monst *)0x0;
        if ((pmVar2->field_0x61 & 2) == 0) {
          pmVar10 = pmVar2;
        }
      }
      if ((((pmVar10 != (monst *)0x0) && ((pmVar10->field_0x62 & 0x80) != 0)) &&
          ((viz_array[y][x] & 2U) != 0)) &&
         (((ptVar11 = t_at(level,x,y), ptVar11 != (trap *)0x0 &&
           (uVar17 = (byte)ptVar11->field_0x8 & 0x1f, uVar17 < 0x14)) &&
          ((0x81820U >> uVar17 & 1) != 0)))) goto LAB_0020b829;
    }
    strcpy(bufs->trapdesc,
           *(char **)((long)defexplain +
                     (ulong)(*(uint *)(level->locations[x] + y) >> 3 & 0xf8) + 0x178));
  }
LAB_0020b829:
  uVar24 = *(uint *)(level->locations[x] + y) >> 0xb & 0x3ff;
  uVar17 = 0xffffffff;
  iVar16 = uVar24 - 1;
  if (uVar24 != 0) {
    if (((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)) {
LAB_0020b937:
      bVar15 = true;
LAB_0020b93a:
      bVar25 = false;
    }
    else {
      if (ublindf == (obj *)0x0) {
        if (uball != (obj *)0x0) goto LAB_0020b8e2;
        goto LAB_0020b937;
      }
      bVar15 = true;
      bVar25 = false;
      if ((ublindf->oartifact != '\x1d') && (bVar25 = false, uball != (obj *)0x0)) {
LAB_0020b8e2:
        bVar15 = true;
        if (((u.bc_felt & 1U) == 0) && ((uball->where != '\x03' && (uball->ox == x)))) {
          bVar15 = uball->oy != y;
        }
        if (((u.bc_felt & 2U) == 0) && (uchain->ox == x)) {
          bVar25 = uchain->oy == y;
          goto LAB_0020b93f;
        }
        goto LAB_0020b93a;
      }
    }
LAB_0020b93f:
    pcVar19 = bufs->objdesc;
    poVar12 = level->objects[x][y];
    if (poVar12 != (obj *)0x0) {
      do {
        if ((((bVar15 ^ 1U) & poVar12 == uball) == 0) && (!(bool)(poVar12 == uchain & bVar25))) {
          if (iVar16 == poVar12->otyp) {
            pcVar13 = distant_name(poVar12,xname);
            strcpy(pcVar19,pcVar13);
            goto LAB_0020ba85;
          }
          break;
        }
        poVar12 = (poVar12->v).v_nexthere;
      } while (poVar12 != (obj *)0x0);
    }
    if (iVar16 == 0) {
      builtin_strncpy(pcVar19,"strange object",0xf);
    }
    else {
      poVar12 = mksobj(level,iVar16,'\0','\0');
      if (poVar12->oclass == '\f') {
        poVar12->quan = 1;
      }
      else if (poVar12->otyp == 0x11e) {
        poVar12->spe = (schar)current_fruit;
      }
      if (*(int *)(level->locations[x] + y) < 0) {
        poVar12->field_0x4b = poVar12->field_0x4b | 0x20;
      }
      pcVar13 = distant_name(poVar12,xname);
      strcpy(pcVar19,pcVar13);
      dealloc_obj(poVar12);
      poVar12 = level->objects[x][y];
    }
LAB_0020ba85:
    if ((level->locations[x][y].field_0x3 & 0x40) != 0) {
      sVar14 = strlen(pcVar19);
      builtin_strncpy(pcVar19 + sVar14," and more",10);
    }
    bVar1 = level->locations[x][y].typ;
    if ((bVar1 & 0xef) == 0) {
      sVar14 = strlen(pcVar19);
      builtin_strncpy(pcVar19 + sVar14," embedded in stone",0x13);
    }
    else if ((char)bVar1 < '\r' || bVar1 == 0xf) {
      sVar14 = strlen(pcVar19);
      builtin_strncpy(pcVar19 + sVar14," embedded in a wall",0x14);
    }
    else {
      bVar5 = closed_door(level,x,y);
      if (bVar5 == '\0') {
        bVar5 = is_pool(level,x,y);
        if (bVar5 == '\0') {
          bVar5 = is_lava(level,x,y);
          if (bVar5 != '\0') {
            sVar14 = strlen(pcVar19);
            builtin_strncpy(pcVar19 + sVar14," in molten lava",0x10);
          }
        }
        else {
          sVar14 = strlen(pcVar19);
          builtin_strncpy(pcVar19 + sVar14," in water",10);
        }
      }
      else {
        sVar14 = strlen(pcVar19);
        builtin_strncpy(pcVar19 + sVar14," embedded in a door",0x14);
      }
    }
    uVar17 = 0xffffffff;
    if ((viz_array[y][x] & 2U) != 0) {
      if (poVar12 == (obj *)0x0) {
        uVar17 = 1;
      }
      else {
        uVar17 = (uint)(iVar16 != poVar12->otyp);
        do {
          uVar17 = uVar17 + (byte)((poVar12 != uchain | bVar25 ^ 1U) & (poVar12 != uball | bVar15));
          poVar12 = (poVar12->v).v_nexthere;
        } while (poVar12 != (obj *)0x0);
      }
    }
  }
  bufs->objcount = uVar17;
  bVar25 = true;
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum == u.umonster) {
      bVar25 = false;
    }
    else {
      bVar5 = dmgtype(youmonst.data,0x24);
      bVar25 = bVar5 != '\0';
    }
  }
  if (iVar6 == 0) goto LAB_0020cc29;
  pcVar19 = bufs->mondesc;
  if ((u.ux == x) && (u.uy == y)) {
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0)) {
      if ((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
            (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
          (u.uprops[0xd].blocked == 0)) &&
         ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
        if (((u._1052_1_ & 4) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
LAB_0020bd61:
          if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
             ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0))))
          goto LAB_0020bd8b;
        }
      }
      else if ((u._1052_1_ & 4) != 0) goto LAB_0020bd61;
    }
    local_238[0] = '\0';
    if (u.umonnum == u.umonster) {
      sprintf(local_238,"%s ",urace.adj);
    }
    pcVar13 = "invisible ";
    if (u.uprops[0xd].blocked != 0) {
      pcVar13 = "";
    }
    pcVar18 = "";
    if (youmonst.data == mons + 0x7b) {
      pcVar18 = pcVar13;
    }
    if (youmonst.data == mons + 0x9e) {
      pcVar18 = pcVar13;
    }
    if (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) {
      pcVar18 = pcVar13;
    }
    pcVar13 = mons_mname(mons + u.umonnum);
    sprintf(pcVar19,"%s%s%s called %s",pcVar18,local_238,pcVar13,plname);
    if (u.usteed != (monst *)0x0) {
      pcVar13 = y_monnam(u.usteed);
      sprintf(local_138,", mounted on %s",pcVar13);
      strcat(pcVar19,local_138);
    }
    if (((((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
             (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
           (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
         ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
        ((u._1052_1_ & 4) != 0)) &&
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0))))
    {
      if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (uVar17 = 0, ((youmonst.data)->mflags3 & 0x100) != 0)) {
        uVar17 = 1;
      }
      uVar24 = uVar17 + 2;
      if (u.uprops[0x19].blocked != 0) {
        uVar24 = uVar17;
      }
      if (u.uprops[0x19].extrinsic == 0) {
        uVar24 = uVar17;
      }
      uVar17 = uVar24 + 4;
      if (u.uprops[0x42].extrinsic == 0 && u.uprops[0x42].intrinsic == 0) {
        uVar17 = uVar24;
      }
      if (uVar17 != 0) {
        pcVar19 = eos(pcVar19);
        pcVar13 = "infravision";
        if ((uVar17 & 1) == 0) {
          pcVar13 = "";
        }
        pcVar22 = ", ";
        pcVar18 = "";
        if ((~uVar17 & 3) == 0) {
          pcVar18 = ", ";
        }
        pcVar21 = "telepathy";
        if ((uVar17 & 2) == 0) {
          pcVar21 = "";
        }
        if (uVar17 < 5) {
          pcVar22 = "";
        }
        pcVar20 = "monster detection";
        if (uVar17 < 4) {
          pcVar20 = "";
        }
        sprintf(pcVar19," [seen: %s%s%s%s%s]",pcVar13,pcVar18,pcVar21,pcVar22,pcVar20);
      }
    }
    goto LAB_0020cc29;
  }
LAB_0020bd8b:
  if (0x193 < iVar6) {
    if (iVar6 < 0x19a) {
      strcat(pcVar19,warnexplain[iVar6 - 0x194]);
    }
    goto LAB_0020cc29;
  }
  pmVar2 = level->monsters[x][y];
  if (pmVar2 == (monst *)0x0) {
    pmVar10 = (monst *)0x0;
  }
  else {
    pmVar10 = (monst *)0x0;
    if ((pmVar2->field_0x61 & 2) == 0) {
      pmVar10 = pmVar2;
    }
  }
  if (pmVar10 == (monst *)0x0) goto LAB_0020cc29;
  bhitpos.x = (xchar)x;
  bhitpos.y = (xchar)y;
  if ((bool)(pmVar10->data == mons + 0x10 & bVar25)) {
    pcVar13 = coyotename(pmVar10,local_238);
  }
  else {
    pcVar13 = distant_monnam(pmVar10,0,local_238);
  }
  if ((pmVar10->mx != x) || (pcVar18 = "", pmVar10->my != y)) {
    pcVar18 = "tail of ";
    if (!bVar25) {
      pcVar18 = "tail of a ";
    }
    if ((pmVar10->field_0x63 & 2) == 0) {
      pcVar18 = "tail of a ";
    }
  }
  if ((bool)(pmVar10->mtame != '\0' & bVar25)) {
    pcVar22 = "tame ";
  }
  else {
    pcVar22 = "peaceful ";
    if (!bVar25) {
      pcVar22 = "";
    }
    if ((pmVar10->field_0x62 & 0x40) == 0) {
      pcVar22 = "";
    }
  }
  sprintf(pcVar19,"%s%s%s",pcVar18,pcVar22,pcVar13);
  if (u.ustuck == pmVar10) {
    if (u.umonnum == u.umonster) {
      pcVar13 = ", holding you";
    }
    else {
      bVar5 = sticks(youmonst.data);
      pcVar13 = ", being held";
      if (bVar5 == '\0') {
        pcVar13 = ", holding you";
      }
    }
    strcat(pcVar19,pcVar13);
  }
  if ((pmVar10->field_0x63 & 1) != 0) {
    sVar14 = strlen(pcVar19);
    builtin_strncpy(pcVar19 + sVar14,", leashed to you",0x11);
  }
  if ((pmVar10->field_0x62 & 0x80) != 0) {
    if ((viz_array[pmVar10->my][pmVar10->mx] & 2U) != 0) {
      ptVar11 = t_at(level,(int)pmVar10->mx,(int)pmVar10->my);
      if (ptVar11 == (trap *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (byte)ptVar11->field_0x8 & 0x1f;
      }
      if ((uVar17 < 0x14) && ((0x81820U >> uVar17 & 1) != 0)) {
        pcVar13 = eos(pcVar19);
        pcVar18 = an(defexplain[(ulong)uVar17 + 0x2f]);
        sprintf(pcVar13,", trapped in %s",pcVar18);
      }
    }
  }
  if (pmVar10->wormno == '\0') {
    if ((viz_array[pmVar10->my][pmVar10->mx] & 2U) != 0) goto LAB_0020c3ce;
    if ((((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
        ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
       ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
        (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_0020c41f;
    bVar25 = false;
    if (((viz_array[pmVar10->my][pmVar10->mx] & 1U) != 0) && ((pmVar10->data->mflags3 & 0x200) != 0)
       ) goto LAB_0020c3ce;
  }
  else {
    bVar5 = worm_known(level,pmVar10);
    if (bVar5 == '\0') {
LAB_0020c41f:
      bVar25 = false;
    }
    else {
LAB_0020c3ce:
      uVar17 = *(uint *)&pmVar10->field_0x60;
      if ((((uVar17 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((char)uVar17 < '\0') goto LAB_0020c41f;
      }
      else {
        bVar25 = false;
        if (((char)uVar17 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_0020c423;
      }
      bVar25 = (u._1052_1_ & 0x20) == 0 && (uVar17 >> 9 & 1) == 0;
    }
  }
LAB_0020c423:
  local_338[0] = '\0';
  iVar6 = -1;
  if (-1 < u.xray_range) {
    iVar6 = u.xray_range * u.xray_range;
  }
  if (pmVar10->wormno == '\0') {
    uVar17 = 0;
    bVar15 = false;
    if ((viz_array[pmVar10->my][pmVar10->mx] & 2U) != 0) goto LAB_0020c491;
  }
  else {
    bVar5 = worm_known(level,pmVar10);
    if (bVar5 == '\0') {
      uVar17 = 0;
      bVar15 = false;
    }
    else {
LAB_0020c491:
      uVar24 = *(uint *)&pmVar10->field_0x60;
      if ((((uVar24 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        uVar17 = 0;
        bVar15 = false;
        if ((uVar24 & 0x280) == 0) goto LAB_0020c4d9;
      }
      else {
        uVar17 = 0;
        bVar15 = false;
        if (((uVar24 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0020c4d9:
          bVar15 = (u._1052_1_ & 0x20) == 0 && (uVar24 & 2) == 0;
          uVar17 = (uint)bVar15;
        }
      }
    }
  }
  if (bVar25) {
    uVar17 = uVar17 + ((*(uint *)&pmVar10->field_0x60 >> 1 & 1) != 0);
  }
  if ((((((pmVar10->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
       (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
     (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
        (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
      (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
        (((youmonst.data)->mflags3 & 0x100) != 0)) && ((pmVar10->data->mflags3 & 0x200) != 0)))))) {
    uVar17 = uVar17 + ((byte)viz_array[pmVar10->my][pmVar10->mx] & 1);
  }
  if ((((pmVar10->data->mflags1 & 0x10000) == 0) &&
      ((poVar12 = which_armor(pmVar10,4), poVar12 == (obj *)0x0 ||
       (poVar12 = which_armor(pmVar10,4), poVar12->otyp != 0x4f)))) &&
     ((((u.uprops[0x1e].intrinsic != 0 ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
          youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
      (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
       (iVar16 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy), iVar16 < 0x41)))))) {
    uVar17 = uVar17 + 1;
  }
  bVar23 = (bool)(0 < iVar6 & bVar25);
  if (bVar23) {
    iVar16 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy);
    uVar17 = uVar17 + (iVar16 <= iVar6);
  }
  bVar3 = u.uprops[0x42].extrinsic != 0;
  bVar4 = u.uprops[0x42].intrinsic != 0;
  bVar5 = match_warn_of_mon(pmVar10);
  iVar16 = ((bVar3 || bVar4) + uVar17 + 1) - (uint)(bVar5 == '\0');
  if (!(bool)(bVar15 & iVar16 < 2)) {
    iVar7 = iVar16;
    if (bVar15) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"normal v",8);
      *(undefined8 *)((long)&uStack_332 + sVar14) = 0x6e6f6973697620;
      iVar7 = iVar16 + -1;
      if (1 < iVar16) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    iVar16 = iVar7;
    if ((bVar25) && ((pmVar10->field_0x60 & 2) != 0)) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"see invi",8);
      *(undefined8 *)((long)&uStack_332 + sVar14) = 0x656c6269736976;
      iVar16 = iVar7 + -1;
      if (1 < iVar7) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    if ((((((((pmVar10->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
           && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) &&
        ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
         (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
       (((pmVar10->data->mflags3 & 0x200) != 0 && ((viz_array[pmVar10->my][pmVar10->mx] & 1U) != 0))
       )) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"infravis",8);
      *(undefined4 *)((long)&uStack_332 + sVar14 + 2) = 0x6e6f69;
      iVar7 = iVar16 + -1;
      bVar25 = 1 < iVar16;
      iVar16 = iVar7;
      if (bVar25) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    if ((((pmVar10->data->mflags1 & 0x10000) == 0) &&
        ((poVar12 = which_armor(pmVar10,4), poVar12 == (obj *)0x0 ||
         (poVar12 = which_armor(pmVar10,4), poVar12->otyp != 0x4f)))) &&
       ((((u.uprops[0x1e].intrinsic != 0 ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
          ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
            (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
            youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
        (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
         (iVar7 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy), iVar7 < 0x41)))))) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"telepath",8);
      *(undefined2 *)((long)&uStack_332 + sVar14 + 2) = 0x79;
      iVar7 = iVar16 + -1;
      bVar25 = 1 < iVar16;
      iVar16 = iVar7;
      if (bVar25) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    iVar7 = iVar16;
    if ((bVar23) &&
       (iVar8 = dist2((int)pmVar10->mx,(int)pmVar10->my,(int)u.ux,(int)u.uy), iVar8 <= iVar6)) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"astral v",8);
      *(undefined8 *)((long)&uStack_332 + sVar14) = 0x6e6f6973697620;
      iVar7 = iVar16 + -1;
      if (1 < iVar16) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    iVar6 = iVar7;
    if (u.uprops[0x42].extrinsic != 0 || u.uprops[0x42].intrinsic != 0) {
      sVar14 = strlen(local_338);
      builtin_strncpy(local_338 + sVar14,"monster ",8);
      builtin_strncpy((char *)((long)&uStack_332 + sVar14 + 2),"detectio",8);
      *(undefined2 *)((long)auStack_328 + sVar14) = 0x6e;
      iVar6 = iVar7 + -1;
      if (1 < iVar7) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
    bVar5 = match_warn_of_mon(pmVar10);
    if (bVar5 != '\0') {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))) {
        pcVar13 = mons_mname(pmVar10->data);
        pcVar13 = makeplural(pcVar13);
        sprintf(local_138,"warned of %s",pcVar13);
        strcat(local_338,local_138);
      }
      else {
        sVar14 = strlen(local_338);
        builtin_strncpy(local_338 + sVar14,"paranoid",8);
        builtin_strncpy((char *)((long)&uStack_332 + sVar14 + 2)," delusio",8);
        *(undefined2 *)((long)auStack_328 + sVar14) = 0x6e;
      }
      if (1 < iVar6) {
        sVar14 = strlen(local_338);
        (local_338 + sVar14)[0] = ',';
        (local_338 + sVar14)[1] = ' ';
        local_338[sVar14 + 2] = '\0';
      }
    }
  }
  if (local_338[0] != '\0') {
    sprintf(local_138," [seen: %s]",local_338);
    sVar14 = strlen(pcVar19);
    strncat(pcVar19,local_138,0xff - sVar14);
  }
LAB_0020cc29:
  if ((level->locations[x][y].field_0x6 & 8) != 0) {
    builtin_strncpy(bufs->invisdesc,"remembered, unseen, creature",0x1d);
  }
  if (((u._1052_1_ & 1) != 0) && ((u.ux != x || (u.uy != y)))) {
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((pcVar19 = "a monster", ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar19 = a_monnam(u.ustuck);
    }
    sprintf(bufs->effectdesc,"interior of %s",pcVar19);
  }
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return;
}

Assistant:

void nh_describe_pos(int x, int y, struct nh_desc_buf *bufs)
{
    int monid = dbuf_get_mon(x, y);
    
    bufs->bgdesc[0] = '\0';
    bufs->trapdesc[0] = '\0';
    bufs->objdesc[0] = '\0';
    bufs->mondesc[0] = '\0';
    bufs->invisdesc[0] = '\0';
    bufs->effectdesc[0] = '\0';
    bufs->objcount = -1;
    
    if (!program_state.game_running || !api_entry_checkpoint())
	return;
    
    describe_bg(x, y, level->locations[x][y].mem_bg, bufs->bgdesc);
    
    if (level->locations[x][y].mem_trap) {
	/* Avoid "monster trapped in a web on a web" from describe_mon(). */
	const struct monst *mtmp;
	const struct trap *t;
	if (!(monid &&					/* monster seen */
		(monid - 1) < NUMMONS &&		/* not a monster warning */
		!(u.ux == x && u.uy == y) &&		/* not the hero */
		(mtmp = m_at(level, x, y)) &&		/* monster at location */
		(mtmp->mtrapped && cansee(x, y)) &&	/* mon seen in trap */
		(t = t_at(level, x, y)) &&		/* trap at location */
		(t->ttyp == BEAR_TRAP || t->ttyp == PIT ||
		 t->ttyp == SPIKED_PIT || t->ttyp == WEB)))
	    strcpy(bufs->trapdesc, trapexplain[level->locations[x][y].mem_trap - 1]);
    }
    
    bufs->objcount = describe_object(x, y, level->locations[x][y].mem_obj - 1,
				     bufs->objdesc);
    
    describe_mon(x, y, monid - 1, bufs->mondesc);
    
    if (level->locations[x][y].mem_invis)
	strcpy(bufs->invisdesc, invisexplain);
    
    if (u.uswallow && (x != u.ux || y != u.uy)) {
	/* all locations when swallowed other than the hero are the monster */
	sprintf(bufs->effectdesc, "interior of %s", Blind ? "a monster" : a_monnam(u.ustuck));
    }
    
    api_exit();
}